

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O1

void __thiscall
preciseunitOps_subnormal_Test::~preciseunitOps_subnormal_Test(preciseunitOps_subnormal_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(preciseunitOps, subnormal)
{
    precise_unit u1(2.3456e-306, precise::m);
    precise_unit u2(2.3457e-306, precise::m);
    // these are equal to within a normal precision floating point.
    EXPECT_TRUE(u1 == u2);
    EXPECT_FALSE(u1 != u2);
    EXPECT_TRUE(u2 == u1);

    precise_unit u3(2.3456e-300, precise::m);
    precise_unit u4(2.3457e-300, precise::m);
    // these are not equal.
    EXPECT_FALSE(u3 == u4);
    EXPECT_TRUE(u3 != u4);
    EXPECT_FALSE(u4 == u3);
}